

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QPolygonF * __thiscall
QGraphicsItem::mapFromParent(QPolygonF *__return_storage_ptr__,QGraphicsItem *this,QRectF *rect)

{
  QGraphicsItemPrivate *this_00;
  long lVar1;
  qreal *pqVar2;
  qreal *pqVar3;
  long in_FS_OFFSET;
  QTransform matrix;
  QPolygonF local_e0;
  qreal local_c8 [9];
  ushort local_80;
  QRectF local_78 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  if (this_00->transformData == (TransformData *)0x0) {
    local_78[0].xp = rect->xp - (this_00->pos).xp;
    local_78[0].yp = rect->yp - (this_00->pos).yp;
    local_78[0].w = rect->w;
    local_78[0].h = rect->h;
    QPolygonF::QPolygonF(__return_storage_ptr__,local_78);
  }
  else {
    pqVar2 = (qreal *)&DAT_00700eb8;
    pqVar3 = local_c8;
    for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
      *pqVar3 = *pqVar2;
      pqVar2 = pqVar2 + 1;
      pqVar3 = pqVar3 + 1;
    }
    pqVar2 = (qreal *)&DAT_00700e28;
    pqVar3 = local_c8;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *pqVar3 = *pqVar2;
      pqVar2 = pqVar2 + 1;
      pqVar3 = pqVar3 + 1;
    }
    local_80 = local_80 & 0xfc00;
    QGraphicsItemPrivate::combineTransformToParent(this_00,(QTransform *)local_c8,(QTransform *)0x0)
    ;
    QTransform::inverted((bool *)local_78);
    QPolygonF::QPolygonF(&local_e0,rect);
    QTransform::map(__return_storage_ptr__);
    if (&(local_e0.super_QList<QPointF>.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e0.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
      ._M_i = ((local_e0.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e0.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e0.super_QList<QPointF>.d.d)->super_QArrayData,0x10,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF QGraphicsItem::mapFromParent(const QRectF &rect) const
{
    // COMBINE
    if (!d_ptr->transformData)
        return rect.translated(-d_ptr->pos);
    return d_ptr->transformToParent().inverted().map(rect);
}